

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leveldbutil.cc
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  Env *env;
  uint uVar2;
  int i;
  ulong uVar3;
  allocator<char> local_8d;
  undefined4 local_8c;
  StdoutPrinter printer;
  Status s;
  string local_70;
  string command;
  
  env = leveldb::Env::Default();
  if (argc < 2) {
    Usage();
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&command,argv[1],(allocator<char> *)&local_70);
    bVar1 = std::operator==(&command,"dump");
    if (bVar1) {
      printer.super_WritableFile._vptr_WritableFile = (WritableFile)&PTR__WritableFile_001164c8;
      local_8c = 0x116401;
      for (uVar3 = 0; argc - 2 != uVar3; uVar3 = uVar3 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,argv[uVar3 + 2],&local_8d);
        leveldb::DumpFile((leveldb *)&s,env,&local_70,&printer.super_WritableFile);
        std::__cxx11::string::_M_dispose();
        __stream = _stderr;
        if (s.state_ != (char *)0x0) {
          leveldb::Status::ToString_abi_cxx11_(&local_70,&s);
          local_8c = 0;
          fprintf(__stream,"%s\n",local_70._M_dataplus._M_p);
          std::__cxx11::string::_M_dispose();
        }
        leveldb::Status::~Status(&s);
      }
      leveldb::WritableFile::~WritableFile(&printer.super_WritableFile);
      uVar2 = (byte)~(byte)local_8c & 1;
    }
    else {
      Usage();
      uVar2 = 1;
    }
    std::__cxx11::string::_M_dispose();
  }
  return uVar2;
}

Assistant:

int main(int argc, char** argv) {
  leveldb::Env* env = leveldb::Env::Default();
  bool ok = true;
  if (argc < 2) {
    Usage();
    ok = false;
  } else {
    std::string command = argv[1];
    if (command == "dump") {
      ok = leveldb::HandleDumpCommand(env, argv + 2, argc - 2);
    } else {
      Usage();
      ok = false;
    }
  }
  return (ok ? 0 : 1);
}